

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.hpp
# Opt level: O2

TermList * __thiscall
Lib::Map<Kernel::TermSpec,_Kernel::TermList,_Lib::DefaultHash>::insert
          (Map<Kernel::TermSpec,_Kernel::TermList,_Lib::DefaultHash> *this,TermSpec *key,
          TermList *val,uint code)

{
  int iVar1;
  anon_struct_8_0_00000001_for___align aVar2;
  anon_struct_8_0_00000001_for___align aVar3;
  Entry *pEVar4;
  
  aVar2 = (anon_struct_8_0_00000001_for___align)(key->term)._content;
  pEVar4 = this->_entries + (ulong)code % (ulong)(uint)this->_capacity;
  while (pEVar4->code != 0) {
    if (((pEVar4->code == code) && ((pEVar4->_key).__align == aVar2)) &&
       (*(int *)((long)&pEVar4->_key + 8) == key->index)) goto LAB_00269f83;
    pEVar4 = pEVar4 + 1;
    if (pEVar4 == this->_afterLast) {
      pEVar4 = this->_entries;
    }
  }
  this->_noOfEntries = this->_noOfEntries + 1;
  iVar1 = key->index;
  aVar3 = (anon_struct_8_0_00000001_for___align)val->_content;
  (pEVar4->_key).__align = aVar2;
  *(int *)((long)&pEVar4->_key + 8) = iVar1;
  (pEVar4->_value).__align = aVar3;
  pEVar4->code = code;
LAB_00269f83:
  return (TermList *)&pEVar4->_value;
}

Assistant:

Val& insert(Key&& key, Val&& val,unsigned code)
  {
    Entry* entry;
    for (entry = firstEntryForCode(code); entry->occupied(); entry = nextEntry(entry)) {
      if (entry->code == code && Hash::equals(entry->key(),key)) {
        return entry->value();
      }
    }
    // entry is not occupied
    _noOfEntries++;
    entry->init(std::move(key), std::move(val), code);
    return entry->value();
  }